

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_00;
  scalar_type *psVar2;
  node_type *pnVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDX;
  undefined4 in_ESI;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_RDI;
  undefined8 in_R8;
  size_type *unaff_retaddr;
  scalar_type *in_stack_00000008;
  box_type right;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  node_type *node;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  double *i;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
  *in_stack_ffffffffffffff00;
  box<double,_2UL> *this_00;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff10;
  kd_tree_node_euclidean<int,_double> *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  box<double,_2UL> local_78;
  int *local_50;
  int *local_48;
  value_type *pvVar4;
  value_type depth_00;
  undefined4 in_stack_ffffffffffffffe0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_01;
  
  depth_00 = (value_type)((ulong)in_R8 >> 0x20);
  end_01._M_current = (int *)in_RDI;
  begin_00._M_current =
       (int *)chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::
              allocate((chunk_allocator<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>
                        *)in_stack_ffffffffffffff00);
  end_00._M_current._4_4_ = in_stack_ffffffffffffff0c;
  end_00._M_current._0_4_ = in_stack_ffffffffffffff08;
  bVar1 = is_leaf<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffff00,
                     (index_type)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     in_stack_ffffffffffffff10,end_00);
  if (bVar1) {
    pvVar4 = (value_type *)begin_00._M_current;
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff00,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffef8);
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffff00,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffef8);
    kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>::set_leaf<int>
              ((kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_> *)
               in_stack_ffffffffffffff10._M_current,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff08);
    compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
                *)in_stack_ffffffffffffff10._M_current,begin_00,in_stack_ffffffffffffff18,
               (box_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  else {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &local_78.storage_.coords_max);
    i = local_78.storage_.coords_min._M_elems + 1;
    this_00 = &local_78;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>_>
                  *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,end_01,
                 (box_type *)begin_00._M_current,in_RDX,unaff_retaddr,in_stack_00000008);
    this_01 = (kd_tree_node_euclidean<int,_double> *)local_78.storage_.coords_min._M_elems[0];
    psVar2 = box<double,_2UL>::max(this_00,(size_type)i);
    *psVar2 = (scalar_type)this_01;
    psVar2 = box<double,_2UL>::min(this_00,(size_type)i);
    *psVar2 = local_78.storage_.coords_min._M_elems[0];
    pnVar3 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,end_01,
                        (box_type *)begin_00._M_current);
    (((value_type *)begin_00._M_current)->
    super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).left =
         pnVar3;
    pnVar3 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),depth_00,in_RCX,end_01,
                        (box_type *)begin_00._M_current);
    (((value_type *)begin_00._M_current)->
    super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).right =
         pnVar3;
    kd_tree_node_euclidean<int,double>::set_branch<pico_tree::internal::box<double,2ul>>
              (this_01,(box<double,_2UL> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),this_00,
               (size_t)i);
    box_base<pico_tree::internal::box<double,2ul>>::fit<pico_tree::internal::box<double,2ul>>
              (in_RDI,(box_base<pico_tree::internal::box<double,_2UL>_> *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    pvVar4 = (value_type *)begin_00._M_current;
  }
  return pvVar4;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }